

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

void * __thiscall QVariant::prepareForEmplace(QVariant *this,QMetaType type)

{
  PrivateShared *pPVar1;
  undefined8 uVar2;
  PrivateShared *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  QMetaTypeInterface *newIface;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((type.d_ptr)->flags & 4) == 0) || (0x18 < (type.d_ptr)->size)) ||
     (8 < (type.d_ptr)->alignment)) {
    uVar8 = *(ulong *)&(this->d).field_0x18;
    if (((uVar8 & 1) != 0) &&
       ((__int_type_conflict)
        (((this->d).data.shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 1)) {
      uVar8 = uVar8 & 0xfffffffffffffffc;
      uVar7 = (uint)(type.d_ptr)->alignment;
      if ((type.d_ptr)->alignment < 9) {
        uVar7 = 8;
      }
      uVar6 = 8;
      if (8 < *(ushort *)(uVar8 + 2)) {
        uVar6 = (uint)*(ushort *)(uVar8 + 2);
      }
      if ((ulong)uVar7 + (ulong)(type.d_ptr)->size <= (ulong)uVar6 + (ulong)*(uint *)(uVar8 + 4)) {
        if (*(code **)(uVar8 + 0x38) != (code *)0x0) {
          pPVar1 = (this->d).data.shared;
          (**(code **)(uVar8 + 0x38))
                    (uVar8,(long)&(pPVar1->ref).super_QAtomicInteger<int>.
                                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> +
                           (long)pPVar1->offset);
        }
        pPVar1 = (this->d).data.shared;
        if (type.d_ptr == (QMetaTypeInterface *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)(type.d_ptr)->alignment;
        }
        pPVar1->offset = (-uVar7 & (int)pPVar1 + uVar7 + 7) - (int)pPVar1;
        *(ulong *)&(this->d).field_0x18 =
             (ulong)((uint)*(undefined8 *)&(this->d).field_0x18 & 3) |
             (ulong)type.d_ptr & 0xfffffffffffffffc;
        this = (QVariant *)
               ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int> + (long)pPVar1->offset);
        goto LAB_002d29d5;
      }
    }
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVariant((QVariant *)&local_48,type.d_ptr);
    pPVar1 = (this->d).data.shared;
    uVar2 = *(undefined8 *)&(this->d).field_0x18;
    uVar4 = *(undefined8 *)((long)&(this->d).data + 8);
    uVar5 = *(undefined8 *)((long)&(this->d).data + 0x10);
    *(undefined8 *)((long)&(this->d).data + 0x10) = local_48._16_8_;
    *(undefined1 **)&(this->d).field_0x18 = puStack_30;
    (this->d).data.shared = local_48.shared;
    *(undefined8 *)((long)&(this->d).data + 8) = local_48._8_8_;
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar3 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar3->offset);
    }
    local_48.shared = pPVar1;
    local_48._8_8_ = uVar4;
    local_48._16_8_ = uVar5;
    puStack_30 = (undefined1 *)uVar2;
    ~QVariant((QVariant *)&local_48);
  }
  else {
    clear(this);
    *(ulong *)&(this->d).field_0x18 =
         (ulong)((uint)*(undefined8 *)&(this->d).field_0x18 & 3) |
         (ulong)type.d_ptr & 0xfffffffffffffffc;
  }
LAB_002d29d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

void *QVariant::prepareForEmplace(QMetaType type)
{
    /* There are two cases where we can reuse the existing storage
       (1) The new type fits in QVariant's SBO storage
       (2) We are using the externally allocated storage, the variant is
           detached, and the new type fits into the existing storage.
       In all other cases (3), we cannot reuse the storage.
     */
    auto typeFits = [&] {
        auto newIface = type.iface();
        auto oldIface = d.typeInterface();
        auto newSize = PrivateShared::computeAllocationSize(newIface->size, newIface->alignment);
        auto oldSize = PrivateShared::computeAllocationSize(oldIface->size, oldIface->alignment);
        return newSize <= oldSize;
    };
    if (Private::canUseInternalSpace(type.iface())) { // (1)
        clear();
        d.packedType = quintptr(type.iface()) >> 2;
        return d.data.data;
    } else if (d.is_shared && isDetached() && typeFits()) { // (2)
        QtMetaTypePrivate::destruct(d.typeInterface(), d.data.shared->data());
        // compare QVariant::PrivateShared::create
        const auto ps = d.data.shared;
        const auto align = type.alignOf();
        ps->offset =  PrivateShared::computeOffset(ps, align);
        d.packedType = quintptr(type.iface()) >> 2;
        return ps->data();
    }
    // (3)
    QVariant newVariant(std::in_place, type);
    swap(newVariant);
    // const cast is safe, we're in a non-const method
    return const_cast<void *>(d.storage());
}